

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::ServiceOptions::MergePartialFromCodedStream
          (ServiceOptions *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  void *pvVar5;
  bool bVar6;
  uint uVar7;
  int byte_limit;
  uint32 uVar8;
  unsigned_long uVar9;
  Type *this_01;
  pair<int,_int> pVar10;
  UnknownFieldSet *pUVar11;
  uint uVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  
  this_00 = &this->_internal_metadata_;
LAB_003c1cf9:
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (uint32)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar12 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar12) < 0x80)) goto LAB_003c1ec5;
        uVar12 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = (ulong)uVar12 | 0x100000000;
    }
    else {
LAB_003c1ec5:
      uVar8 = io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar13 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar8 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) {
LAB_003c1dd2:
      if (uVar12 == 0) {
        return true;
      }
      if ((uVar12 & 7) == 4) {
        return true;
      }
      pvVar5 = (this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (uVar12 < 8000) {
        if (((ulong)pvVar5 & 1) == 0) {
          pUVar11 = internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar11 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
        }
        bVar6 = internal::WireFormat::SkipField(input,uVar12,pUVar11);
      }
      else {
        if (((ulong)pvVar5 & 1) == 0) {
          pUVar11 = internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar11 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
        }
        bVar6 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,uVar12,input,
                           (Message *)&_ServiceOptions_default_instance_,pUVar11);
      }
      if (bVar6 == false) {
        return false;
      }
      goto LAB_003c1cf9;
    }
    uVar7 = (uint)(uVar13 >> 3) & 0x1fffffff;
    if (uVar7 == 999) {
      if ((char)uVar13 != ':') goto LAB_003c1dd2;
      this_01 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar10 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
      if ((long)pVar10 < 0) {
        return false;
      }
      bVar6 = UninterpretedOption::MergePartialFromCodedStream(this_01,input);
      if (!bVar6) {
        return false;
      }
      bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar10.first);
      if (!bVar6) {
        return false;
      }
    }
    else {
      if ((uVar7 != 0x21) || ((char)uVar13 != '\b')) goto LAB_003c1dd2;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9))
      {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar14 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->deprecated_ = uVar9 != 0;
    }
  } while( true );
}

Assistant:

bool ServiceOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.ServiceOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool deprecated = 33 [default = false];
      case 33: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(264u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.ServiceOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.ServiceOptions)
  return false;
#undef DO_
}